

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void dccvap_writefn(CPUARMState_conflict *env,ARMCPRegInfo_conflict *opaque,uint64_t value)

{
  uc_struct_conflict2 *uc;
  uint32_t mmu_idx;
  void *ptr;
  long lVar1;
  uintptr_t unaff_retaddr;
  ram_addr_t offset;
  
  uc = env->uc;
  lVar1 = 4L << (*(byte *)((long)env[1].xregs + 0xd6) & 0xf);
  mmu_idx = extract32(env->hflags,0x18,4);
  ptr = probe_access_aarch64(env,-lVar1 & value,(int)lVar1,MMU_DATA_LOAD,mmu_idx,unaff_retaddr);
  if (ptr != (void *)0x0) {
    memory_region_from_host_aarch64(uc,ptr,&offset);
  }
  return;
}

Assistant:

static void dccvap_writefn(CPUARMState *env, const ARMCPRegInfo *opaque,
                          uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    struct uc_struct *uc = env->uc;
    /* CTR_EL0 System register -> DminLine, bits [19:16] */
    uint64_t dline_size = 4 << ((cpu->ctr >> 16) & 0xF);
    uint64_t vaddr_in = (uint64_t) value;
    uint64_t vaddr = vaddr_in & ~(dline_size - 1);
    void *haddr;
    int mem_idx = cpu_mmu_index(env, false);

    /* This won't be crossing page boundaries */
    haddr = probe_read(env, vaddr, dline_size, mem_idx, GETPC());
    if (haddr) {

        ram_addr_t offset;
        MemoryRegion *mr;

        /* RCU lock is already being held */
        mr = memory_region_from_host(uc, haddr, &offset);
        if (mr) {
            // memory_region_do_writeback(mr, offset, dline_size); FIXME
        }
    }
}